

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

word Nf_MatchRef_rec(Nf_Man_t *p,int i,int c,Nf_Mat_t *pM,word Required,Vec_Int_t *vBackup)

{
  uint *puVar1;
  int iVar2;
  void *pvVar3;
  int *piVar4;
  word wVar5;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  word *pwVar10;
  uint uVar11;
  bool bVar12;
  word local_50;
  
  uVar11 = *(uint *)pM;
  if (-1 < (int)uVar11) {
    __assert_fail("pM->fBest",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                  ,0x6ba,"word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, word, Vec_Int_t *)"
                 );
  }
  if (Required < pM->D) {
    __assert_fail("pM->D <= Required",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                  ,0x6bb,"word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, word, Vec_Int_t *)"
                 );
  }
  if ((uVar11 >> 0x1e & 1) == 0) {
    if ((i < 0) || ((p->vCutSets).nSize <= i)) {
LAB_006fe913:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar2 = (p->vCutSets).pArray[(uint)i];
    if (iVar2 == 0) {
      return 0;
    }
    uVar9 = iVar2 >> 0x10;
    if (((int)uVar9 < 0) || ((p->vPages).nSize <= (int)uVar9)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    uVar6 = uVar11 >> 0x14 & 0x3ff;
    if (uVar6 == 0) {
      __assert_fail("h > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                    ,0x96,"int *Nf_CutFromHandle(int *, int)");
    }
    pvVar3 = (p->vPages).pArray[uVar9];
    bVar8 = 0;
    if ((*(byte *)((long)pvVar3 + (ulong)uVar6 * 4 + (ulong)(ushort)iVar2 * 4) & 0x1f) == 0) {
      local_50 = 0;
    }
    else {
      puVar1 = (uint *)((long)pvVar3 + (ulong)uVar6 * 4 + (ulong)(ushort)iVar2 * 4);
      uVar7 = 0;
      local_50 = 0;
      do {
        uVar11 = *(uint *)pM;
        uVar9 = puVar1[(ulong)(((uint)pM->Cfg >> 8) >> (bVar8 & 0x1f) & 0xf) + 1];
        if ((ulong)uVar9 == 0) goto LAB_006fe8ea;
        bVar12 = (((uint)pM->Cfg >> 1 & 0x7f) >> ((uint)uVar7 & 0x1f) & 1) != 0;
        wVar5 = p->pCells[uVar11 & 0xfffff].Delays[uVar7];
        if (vBackup == (Vec_Int_t *)0x0) {
          if ((int)uVar9 < 0) goto LAB_006fe932;
          uVar11 = (uint)bVar12 + uVar9 * 2;
        }
        else {
          if ((int)uVar9 < 0) goto LAB_006fe932;
          uVar11 = (uint)bVar12 + uVar9 * 2;
          Vec_IntPush(vBackup,uVar11);
        }
        if ((p->vMapRefs).nSize <= (int)uVar11) goto LAB_006fe913;
        piVar4 = (p->vMapRefs).pArray;
        iVar2 = piVar4[uVar11];
        if (iVar2 < 0) {
          __assert_fail("Nf_ObjMapRefNum(p, iVar, fCompl) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                        ,0x6ce,
                        "word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, word, Vec_Int_t *)")
          ;
        }
        piVar4[uVar11] = iVar2 + 1;
        if (iVar2 == 0) {
          wVar5 = Nf_MatchRef_rec(p,uVar9,(uint)bVar12,
                                  (Nf_Mat_t *)
                                  (&p->pNfObjs[uVar9].M[0][0].field_0x0 +
                                  ((uint)bVar12 + (uint)bVar12 * 2) * 0x10),Required - wVar5,vBackup
                                 );
          local_50 = local_50 + wVar5;
        }
        uVar7 = uVar7 + 1;
        bVar8 = bVar8 + 4;
      } while (uVar7 < (*puVar1 & 0x1f));
      uVar11 = *(uint *)pM;
    }
LAB_006fe8ea:
    pwVar10 = &p->pCells[uVar11 & 0xfffff].Area;
  }
  else {
    wVar5 = p->InvDelay;
    if (vBackup == (Vec_Int_t *)0x0) {
      if (i < 0) goto LAB_006fe932;
    }
    else {
      if (i < 0) {
LAB_006fe932:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10b,"int Abc_Var2Lit(int, int)");
      }
      Vec_IntPush(vBackup,(uint)(c == 0) + i * 2);
    }
    uVar11 = i * 2 | (uint)(c == 0);
    if ((p->vMapRefs).nSize <= (int)uVar11) goto LAB_006fe913;
    piVar4 = (p->vMapRefs).pArray;
    iVar2 = piVar4[uVar11];
    if (iVar2 < 0) {
      __assert_fail("Nf_ObjMapRefNum(p, i, !c) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                    ,0x6c1,
                    "word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, word, Vec_Int_t *)");
    }
    piVar4[uVar11] = iVar2 + 1;
    local_50 = 0;
    if (iVar2 == 0) {
      local_50 = Nf_MatchRef_rec(p,i,(uint)(c == 0),
                                 (Nf_Mat_t *)
                                 (&p->pNfObjs[(uint)i].M[0][0].field_0x0 + (uint)(c == 0) * 0x30),
                                 Required - wVar5,vBackup);
    }
    pwVar10 = &p->InvArea;
  }
  return local_50 + *pwVar10;
}

Assistant:

word Nf_MatchRef_rec( Nf_Man_t * p, int i, int c, Nf_Mat_t * pM, word Required, Vec_Int_t * vBackup )
{
    word Area = 0, ReqFanin;
    int k, iVar, fCompl, * pCut;
    assert( pM->fBest );
    assert( pM->D <= Required );
    if ( pM->fCompl )
    {
        ReqFanin = Required - p->InvDelay;
        if ( vBackup )
            Vec_IntPush( vBackup, Abc_Var2Lit(i, !c) );
        assert( Nf_ObjMapRefNum(p, i, !c) >= 0 );
        if ( !Nf_ObjMapRefInc(p, i, !c) )
            Area += Nf_MatchRef_rec( p, i, !c, Nf_ObjMatchD(p, i, !c), ReqFanin, vBackup );
        return Area + p->InvArea;
    }
    if ( Nf_ObjCutSetId(p, i) == 0 )
        return 0;
    pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pM->CutH );
    Nf_CutForEachVarCompl( pCut, pM->Cfg, iVar, fCompl, k )
    {
        ReqFanin = Required - Nf_ManCell(p, pM->Gate)->Delays[k];
        if ( vBackup )
            Vec_IntPush( vBackup, Abc_Var2Lit(iVar, fCompl) );
        assert( Nf_ObjMapRefNum(p, iVar, fCompl) >= 0 );
        if ( !Nf_ObjMapRefInc(p, iVar, fCompl) )
            Area += Nf_MatchRef_rec( p, iVar, fCompl, Nf_ObjMatchD(p, iVar, fCompl), ReqFanin, vBackup );
    }
    return Area + Nf_ManCell(p, pM->Gate)->Area;
}